

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# filemgr.cc
# Opt level: O2

stale_regions *
filemgr_actual_stale_regions
          (stale_regions *__return_storage_ptr__,filemgr *file,bid_t offset,size_t length)

{
  filemgr_magic_t magic;
  size_t __size;
  undefined8 uVar1;
  long lVar2;
  long lVar3;
  list_elem *plVar4;
  list_elem *plVar5;
  void *buf;
  filemgr *file_00;
  bool bVar6;
  ulong bid;
  ulong uVar7;
  stale_data *psVar8;
  anon_union_40_2_882dd8ce_for_stale_regions_1 *paVar9;
  ulong uVar10;
  ulong uVar11;
  long lVar12;
  anon_union_40_2_882dd8ce_for_stale_regions_1 *paVar13;
  size_t sVar14;
  size_t sStack_70;
  void *local_68;
  size_t local_60;
  anon_union_40_2_882dd8ce_for_stale_regions_1 *local_58;
  filemgr *local_50;
  stale_regions *local_48;
  ulong local_40;
  ulong local_38;
  
  uVar11 = (ulong)file->blocksize;
  lVar2 = -(uVar11 + 0xf & 0xfffffffffffffff0);
  local_68 = (void *)((long)&local_68 + lVar2);
  magic = file->version;
  *(undefined8 *)((long)&sStack_70 + lVar2) = 0x1157e3;
  bVar6 = ver_non_consecutive_doc(magic);
  if (bVar6) {
    local_50 = file;
    bid = offset / file->blocksize;
    uVar10 = offset % (ulong)file->blocksize;
    uVar7 = uVar11 - 0x10;
    lVar12 = 0;
    local_48 = __return_storage_ptr__;
    sVar14 = 0;
    local_60 = length;
    local_40 = uVar11;
    local_38 = uVar7;
    local_58 = &__return_storage_ptr__->field_1;
    paVar9 = &__return_storage_ptr__->field_1;
    while (length != 0) {
      paVar13 = paVar9;
      if (sVar14 != 0) {
        if (sVar14 == 1) {
          uVar7 = local_60 / uVar7;
          *(undefined8 *)((long)&sStack_70 + lVar2) = 0x28;
          __size = *(size_t *)((long)&sStack_70 + lVar2);
          *(undefined8 *)((long)&sStack_70 + lVar2) = 0x115859;
          psVar8 = (stale_data *)calloc(uVar7 + 2,__size);
          lVar3 = *(long *)((long)local_58 + 8);
          plVar4 = *(list_elem **)((long)local_58 + 0x10);
          plVar5 = *(list_elem **)((long)local_58 + 0x18);
          psVar8->pos = (uint64_t)local_58->regions;
          *(long *)&psVar8->len = lVar3;
          (psVar8->field_2).le.prev = plVar4;
          (psVar8->field_2).le.next = plVar5;
          (psVar8->field_2).avl.right = *(avl_node **)((long)local_58 + 0x20);
          local_58->regions = psVar8;
          uVar11 = local_40;
          uVar7 = local_38;
          paVar13 = local_58;
        }
        else {
          psVar8 = paVar9->regions;
        }
        paVar9 = (anon_union_40_2_882dd8ce_for_stale_regions_1 *)((long)&psVar8->pos + lVar12);
      }
      file_00 = local_50;
      buf = local_68;
      paVar9->regions = (stale_data *)(bid * uVar11 + uVar10);
      if (length < uVar7 - uVar10) {
        (paVar9->region).len = (uint32_t)length;
LAB_001158e4:
        length = 0;
      }
      else {
        (paVar9->region).len = (int)uVar11 - (int)uVar10;
        length = length - (uVar7 - uVar10);
        if (length == 0) goto LAB_001158e4;
        *(undefined8 *)((long)&sStack_70 + lVar2) = 1;
        uVar1 = *(undefined8 *)((long)&sStack_70 + lVar2);
        *(undefined8 *)((long)&sStack_70 + lVar2) = 0x1158d1;
        filemgr_read(file_00,bid,buf,(err_log_callback *)0x0,SUB81(uVar1,0));
        uVar11 = *(ulong *)((long)buf + local_38);
        bid = uVar11 >> 0x38 | (uVar11 & 0xff000000000000) >> 0x28 |
              (uVar11 & 0xff0000000000) >> 0x18 | (uVar11 & 0xff00000000) >> 8 |
              (uVar11 & 0xff000000) << 8 | (uVar11 & 0xff0000) << 0x18 | (uVar11 & 0xff00) << 0x28 |
              uVar11 << 0x38;
        uVar10 = 0;
        uVar11 = local_40;
        uVar7 = local_38;
      }
      sVar14 = sVar14 + 1;
      lVar12 = lVar12 + 0x28;
      paVar9 = paVar13;
    }
    local_48->n_regions = sVar14;
  }
  else {
    __return_storage_ptr__->n_regions = 1;
    (__return_storage_ptr__->field_1).region.pos = offset;
    *(undefined8 *)((long)&sStack_70 + lVar2) = 0x11590c;
    sVar14 = filemgr_actual_stale_length(file,offset,length);
    (__return_storage_ptr__->field_1).region.len = (uint32_t)sVar14;
    local_48 = __return_storage_ptr__;
  }
  return local_48;
}

Assistant:

struct stale_regions filemgr_actual_stale_regions(struct filemgr *file,
                                                  bid_t offset,
                                                  size_t length)
{
    uint8_t *buf = alca(uint8_t, file->blocksize);
    size_t remaining = length;
    size_t real_blocksize = file->blocksize;
    size_t blocksize = real_blocksize;
    size_t cur_pos, space_in_block, count;
    bid_t cur_bid;
    bool non_consecutive = ver_non_consecutive_doc(file->version);
    struct docblk_meta blk_meta;
    struct stale_regions ret;
    struct stale_data *arr = NULL, *cur_region;

    if (non_consecutive) {
        blocksize -= DOCBLK_META_SIZE;

        cur_bid = offset / file->blocksize;
        // relative position in the block 'cur_bid'
        cur_pos = offset % file->blocksize;

        count = 0;
        while (remaining) {
            if (count == 1) {
                // more than one stale region .. allocate array
                size_t arr_size = (length / blocksize) + 2;
                arr = (struct stale_data *)calloc(arr_size, sizeof(struct stale_data));
                arr[0] = ret.region;
                ret.regions = arr;
            }

            if (count == 0) {
                // Since n_regions will be 1 in most cases,
                // we do not allocate heap memory when 'n_regions==1'.
                cur_region = &ret.region;
            } else {
                cur_region = &ret.regions[count];
            }
            cur_region->pos = (cur_bid * real_blocksize) + cur_pos;

            // subtract data size in the current block
            space_in_block = blocksize - cur_pos;
            if (space_in_block <= remaining) {
                // rest of the current block (including block meta)
                cur_region->len = real_blocksize - cur_pos;
                remaining -= space_in_block;
            } else {
                cur_region->len = remaining;
                remaining = 0;
            }
            count++;

            if (remaining) {
                // get next BID
                filemgr_read(file, cur_bid, (void *)buf, NULL, true);
                memcpy(&blk_meta, buf + blocksize, sizeof(blk_meta));
                cur_bid = _endian_decode(blk_meta.next_bid);
                cur_pos = 0; // beginning of the block
            }
        }
        ret.n_regions = count;

    } else {
        // doc blocks are consecutive .. always return a single region.
        ret.n_regions = 1;
        ret.region.pos = offset;
        ret.region.len = filemgr_actual_stale_length(file, offset, length);
    }

    return ret;
}